

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::UniformCase::writeUniformCompareExpr
          (UniformCase *this,ostringstream *dst,BasicUniform *uniform)

{
  DataType DVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  ostringstream *poVar5;
  size_type sVar6;
  VarValue *value;
  int iVar7;
  pointer pcVar8;
  uint uVar9;
  string local_40;
  
  DVar1 = uniform->type;
  std::__ostream_insert<char,std::char_traits<char>>
            (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"compare_",8);
  if (DVar1 - TYPE_SAMPLER_1D < 0x1e) {
    uVar9 = uniform->type - TYPE_SAMPLER_2D;
    DVar1 = TYPE_LAST;
    if (uVar9 < 0x19) {
      DVar1 = *(DataType *)(&DAT_01c4b268 + (ulong)uVar9 * 4);
    }
    pcVar2 = glu::getDataTypeName(DVar1);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)dst +
                      (int)(dst->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (&dst->super_basic_ostream<char,_std::char_traits<char>_>,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"(texture(",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                        (uniform->name)._M_dataplus._M_p,(uniform->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", vec",5);
    uVar9 = uniform->type - TYPE_SAMPLER_2D;
    iVar7 = 0;
    if (uVar9 < 0x19) {
      iVar7 = *(int *)(&DAT_01c4b204 + (ulong)uVar9 * 4);
    }
    poVar5 = (ostringstream *)std::ostream::operator<<(poVar4,iVar7);
    pcVar8 = "(0.0))";
    sVar6 = 6;
  }
  else {
    pcVar2 = glu::getDataTypeName(uniform->type);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)dst +
                      (int)(dst->super_basic_ostream<char,_std::char_traits<char>_>).
                           _vptr_basic_ostream[-3]);
    }
    else {
      sVar3 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (&dst->super_basic_ostream<char,_std::char_traits<char>_>,pcVar2,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"(",1);
    pcVar8 = (uniform->name)._M_dataplus._M_p;
    sVar6 = (uniform->name)._M_string_length;
    poVar5 = dst;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&poVar5->super_basic_ostream<char,_std::char_traits<char>_>,pcVar8,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (&dst->super_basic_ostream<char,_std::char_traits<char>_>,", ",2);
  shaderVarValueStr_abi_cxx11_(&local_40,(Functional *)&uniform->finalValue,value);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                      local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void UniformCase::writeUniformCompareExpr (std::ostringstream& dst, const BasicUniform& uniform) const
{
	if (glu::isDataTypeSampler(uniform.type))
		dst << "compare_" << glu::getDataTypeName(getSamplerLookupReturnType(uniform.type)) << "(texture(" << uniform.name << ", vec" << getSamplerNumLookupDimensions(uniform.type) << "(0.0))";
	else
		dst << "compare_" << glu::getDataTypeName(uniform.type) << "(" << uniform.name;

	dst << ", " << shaderVarValueStr(uniform.finalValue) << ")";
}